

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int doencode64(char *outfile,LONGLONG *a,int nx,int ny,uchar *nbitplanes)

{
  char *in_RDI;
  int stat;
  int ny2;
  int nx2;
  char *in_stack_00000038;
  undefined4 local_2c;
  
  start_outputing_bits();
  local_2c = qtree_encode64(in_stack_00000038,(LONGLONG *)outfile,a._4_4_,(int)a,nx,ny);
  if (local_2c == 0) {
    local_2c = qtree_encode64(in_stack_00000038,(LONGLONG *)outfile,a._4_4_,(int)a,nx,ny);
  }
  if (local_2c == 0) {
    local_2c = qtree_encode64(in_stack_00000038,(LONGLONG *)outfile,a._4_4_,(int)a,nx,ny);
  }
  if (local_2c == 0) {
    local_2c = qtree_encode64(in_stack_00000038,(LONGLONG *)outfile,a._4_4_,(int)a,nx,ny);
  }
  output_nybble(in_RDI,0);
  done_outputing_bits(in_RDI);
  return local_2c;
}

Assistant:

static int
doencode64(char *outfile, LONGLONG a[], int nx, int ny, unsigned char nbitplanes[3])
{
/* char *outfile;						 output data stream
LONGLONG a[];							 Array of values to encode			
int nx,ny;							 Array dimensions [nx][ny]			
unsigned char nbitplanes[3];		 Number of bit planes in quadrants	
*/

int nx2, ny2, stat;

	nx2 = (nx+1)/2;
	ny2 = (ny+1)/2;
	/*
	 * Initialize bit output
	 */
	start_outputing_bits();
	/*
	 * write out the bit planes for each quadrant
	 */
	stat = qtree_encode64(outfile, &a[0],          ny, nx2,  ny2,  nbitplanes[0]);

        if (!stat)
		stat = qtree_encode64(outfile, &a[ny2],        ny, nx2,  ny/2, nbitplanes[1]);

        if (!stat)
		stat = qtree_encode64(outfile, &a[ny*nx2],     ny, nx/2, ny2,  nbitplanes[1]);

        if (!stat)
		stat = qtree_encode64(outfile, &a[ny*nx2+ny2], ny, nx/2, ny/2, nbitplanes[2]);
	/*
	 * Add zero as an EOF symbol
	 */
	output_nybble(outfile, 0);
	done_outputing_bits(outfile);
	
	return(stat);
}